

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall QSocks5BindStore::timerEvent(QSocks5BindStore *this,QTimerEvent *event)

{
  long lVar1;
  const_iterator it_00;
  bool bVar2;
  TimerId TVar3;
  TimerId TVar4;
  QSocks5BindData **ppQVar5;
  ulong uVar6;
  QTimerEvent *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  iterator iVar7;
  iterator end;
  iterator it;
  QMutexLocker<QRecursiveMutex> lock;
  QRecursiveMutex *in_stack_ffffffffffffff78;
  QMutexLocker<QRecursiveMutex> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  const_iterator local_58;
  piter local_48;
  piter local_38;
  Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *local_28;
  Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *pDVar8;
  size_t sVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar9 = 0xaaaaaaaaaaaaaaaa;
  QMutexLocker<QRecursiveMutex>::QMutexLocker(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  TVar3 = QTimerEvent::id(in_RSI);
  TVar4 = QBasicTimer::id((QBasicTimer *)&in_RDI[2].i.bucket);
  if (TVar3 == TVar4) {
    local_28 = (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0xaaaaaaaaaaaaaaaa;
    iVar7 = QHash<long_long,_QSocks5BindData_*>::begin
                      ((QHash<long_long,_QSocks5BindData_*> *)in_RSI);
    local_28 = iVar7.i.d;
    pDVar8 = (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)iVar7.i.bucket;
    local_38.bucket = 0xaaaaaaaaaaaaaaaa;
    local_38.d = (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0xaaaaaaaaaaaaaaaa;
    local_38 = (piter)QHash<long_long,_QSocks5BindData_*>::end
                                ((QHash<long_long,_QSocks5BindData_*> *)in_RDI);
    while (bVar2 = QHash<long_long,_QSocks5BindData_*>::iterator::operator!=
                             (in_RDI,(iterator *)in_stack_ffffffffffffff80), bVar2) {
      ppQVar5 = QHash<long_long,_QSocks5BindData_*>::iterator::value((iterator *)0x36ee82);
      uVar6 = QElapsedTimer::hasExpired((longlong)&(*ppQVar5)->timeStamp);
      if ((uVar6 & 1) == 0) {
        QHash<long_long,_QSocks5BindData_*>::iterator::operator++
                  ((iterator *)CONCAT44(TVar3,in_stack_ffffffffffffff90));
      }
      else {
        in_stack_ffffffffffffff80 = (QMutexLocker<QRecursiveMutex> *)(in_RDI + 3);
        QHash<long_long,_QSocks5BindData_*>::const_iterator::const_iterator
                  (&local_58,(iterator *)&local_28);
        it_00.i.bucket = sVar9;
        it_00.i.d = pDVar8;
        local_48 = (piter)QHash<long_long,_QSocks5BindData_*>::erase
                                    ((QHash<long_long,_QSocks5BindData_*> *)in_RSI,it_00);
        local_28 = local_48.d;
        pDVar8 = (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)local_48.bucket;
      }
    }
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker(in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocks5BindStore::timerEvent(QTimerEvent * event)
{
    QMutexLocker lock(&mutex);
    if (event->id() == sweepTimer.id()) {
        QSOCKS5_DEBUG << "QSocks5BindStore performing sweep";
        for (auto it = store.begin(), end = store.end(); it != end;) {
            if (it.value()->timeStamp.hasExpired(350000)) {
                QSOCKS5_DEBUG << "QSocks5BindStore removing JJJJ";
                it = store.erase(it);
            } else {
                ++it;
            }
        }
    }
}